

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * __thiscall
httplib::detail::from_i_to_hex_abi_cxx11_(string *__return_storage_ptr__,detail *this,size_t n)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  do {
    std::operator+(&local_40,"0123456789abcdef"[(uint)this & 0xf],__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    bVar1 = (detail *)0xf < this;
    this = (detail *)((ulong)this >> 4);
  } while (bVar1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string from_i_to_hex(size_t n) {
            const char* charset = "0123456789abcdef";
            std::string ret;
            do {
                ret = charset[n & 15] + ret;
                n >>= 4;
            } while (n > 0);
            return ret;
        }